

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

void accommodateAlienBasis(HighsLpSolverObject *solver_object)

{
  uint uVar1;
  uint uVar2;
  HighsBasis *pHVar3;
  HighsOptions *pHVar4;
  pointer pHVar5;
  pointer basic_index_00;
  int iVar6;
  HighsInt HVar7;
  ulong uVar8;
  HighsInt num_basic;
  uint uVar9;
  ulong uVar10;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *pvVar11;
  vector<int,_std::allocator<int>_> basic_index;
  HFactor factor;
  vector<int,_std::allocator<int>_> local_7d8;
  HighsOptions *local_7b8;
  HighsLp *local_7b0;
  HFactor local_7a8;
  
  local_7b0 = solver_object->lp_;
  pHVar3 = solver_object->basis_;
  pHVar4 = solver_object->options_;
  uVar1 = local_7b0->num_col_;
  uVar2 = local_7b0->num_row_;
  local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (HighsInt *)0x0;
  local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_7a8.build_realTick = (double)((ulong)local_7a8.build_realTick & 0xffffffff00000000);
  if (0 < (int)uVar1) {
    iVar6 = 0;
    do {
      if ((pHVar3->col_status).
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] == kBasic) {
        if (local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_7d8,
                     (iterator)
                     local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_7a8);
        }
        else {
          *local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar6;
          local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      iVar6 = local_7a8.build_realTick._0_4_ + 1;
      local_7a8.build_realTick = (double)CONCAT44(local_7a8.build_realTick._4_4_,iVar6);
    } while (iVar6 < (int)uVar1);
  }
  local_7b8 = pHVar4;
  if (0 < (int)uVar2) {
    uVar10 = 0;
    do {
      if ((pHVar3->row_status).
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] == kBasic) {
        iVar6 = uVar1 + (int)uVar10;
        local_7a8.build_realTick = (double)CONCAT44(local_7a8.build_realTick._4_4_,iVar6);
        if (local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_7d8,
                     (iterator)
                     local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_7a8);
        }
        else {
          *local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar6;
          local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  basic_index_00 =
       local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  uVar10 = (ulong)((long)local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_7a8.refactor_info_.pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.refactor_info_.pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.refactor_info_.pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.refactor_info_.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.refactor_info_.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.refactor_info_.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.refactor_info_.pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.refactor_info_.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.refactor_info_.pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.a_matrix_valid = false;
  local_7a8.use_original_HFactor_logic = false;
  local_7a8.debug_report_ = false;
  local_7a8.basis_matrix_limit_size = 0;
  local_7a8.update_method = 0;
  local_7a8.build_timer_ = (HighsTimer *)0x0;
  local_7a8.nwork = 0;
  local_7a8.rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_7a8.rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_7a8.rhs_.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_7a8.rhs_.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.rhs_.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.rhs_.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.rhs_.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_7a8.rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_7a8.rhs_.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_7a8.rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.rhs_.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.rhs_.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.rank_deficiency = 0;
  local_7a8.build_realTick = 0.0;
  local_7a8.build_synthetic_tick = 0.0;
  local_7a8.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_7a8._89_8_ = 0;
  local_7a8.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_7a8.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_7a8.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7a8.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.num_row = 0;
  local_7a8.num_col = 0;
  local_7a8.num_basic = 0;
  local_7a8.basis_matrix_num_el = 0;
  local_7a8.invert_num_el = 0;
  local_7a8.kernel_dim = 0;
  local_7a8.kernel_num_el = 0;
  local_7a8.highs_debug_level = 0;
  local_7a8.pivot_threshold = 0.0;
  local_7a8.pivot_tolerance = 0.0;
  local_7a8.a_value = (double *)0x0;
  local_7a8.basic_index = (HighsInt *)0x0;
  local_7a8.a_start = (HighsInt *)0x0;
  local_7a8.a_index = (HighsInt *)0x0;
  local_7a8.log_options.user_callback_data._0_1_ = 0;
  local_7a8.log_options._81_8_ = 0;
  local_7a8.log_options.user_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_7a8.log_options.user_callback._M_invoker._0_1_ = 0;
  local_7a8.log_options.user_callback._M_invoker._1_7_ = 0;
  local_7a8.log_options.user_callback.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_7a8.log_options.user_callback.super__Function_base._M_functor._8_8_ = 0;
  local_7a8.log_options.user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  local_7a8.log_options.user_log_callback_data = (void *)0x0;
  local_7a8.log_options.log_to_console = (bool *)0x0;
  local_7a8.log_options.log_dev_level = (HighsInt *)0x0;
  local_7a8.log_options.log_stream = (FILE *)0x0;
  local_7a8.log_options.output_flag = (bool *)0x0;
  local_7a8.time_limit_ = 0.0;
  local_7a8.log_data._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl =
       (__uniq_ptr_data<HFactor::LogData,_std::default_delete<HFactor::LogData>,_true,_true>)
       (__uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>)0x0;
  memset(&local_7a8.iwork,0,0x518);
  num_basic = (HighsInt)uVar10;
  HFactor::setupGeneral
            (&local_7a8,&local_7b0->a_matrix_,num_basic,basic_index_00,0.1,1e-10,0,
             &(local_7b8->super_HighsOptionsStruct).log_options);
  HVar7 = HFactor::build(&local_7a8,(HighsTimerClock *)0x0);
  if (0 < (int)uVar1) {
    pHVar5 = (pHVar3->col_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      if (pHVar5[uVar8] == kBasic) {
        pHVar5[uVar8] = kNonbasic;
      }
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  if (0 < (int)uVar2) {
    pHVar5 = (pHVar3->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      if (pHVar5[uVar8] == kBasic) {
        pHVar5[uVar8] = kNonbasic;
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  uVar10 = uVar10 & 0xffffffff;
  if ((int)uVar2 < num_basic) {
    uVar10 = (ulong)uVar2;
  }
  iVar6 = (int)uVar10;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  else {
    uVar8 = 0;
    do {
      pvVar11 = &pHVar3->row_status;
      uVar9 = uVar1;
      if (local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8] < (int)uVar1) {
        uVar9 = 0;
        pvVar11 = &pHVar3->col_status;
      }
      (pvVar11->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
      super__Vector_impl_data._M_start
      [(int)(local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar8] - uVar9)] = kBasic;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  if (uVar2 - iVar6 != 0 && iVar6 <= (int)uVar2) {
    pHVar5 = (pHVar3->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      pHVar5[local_7a8.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)HVar7 + uVar10]] = kBasic;
      uVar10 = uVar10 + 1;
    } while (uVar2 - iVar6 != uVar10);
  }
  HFactor::~HFactor(&local_7a8);
  if (local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (HighsInt *)0x0) {
    operator_delete(local_7d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void accommodateAlienBasis(HighsLpSolverObject& solver_object) {
  HighsLp& lp = solver_object.lp_;
  HighsBasis& basis = solver_object.basis_;
  HighsOptions& options = solver_object.options_;
  assert(basis.alien);
  HighsInt num_row = lp.num_row_;
  HighsInt num_col = lp.num_col_;
  assert((int)basis.col_status.size() >= num_col);
  assert((int)basis.row_status.size() >= num_row);
  std::vector<HighsInt> basic_index;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      basic_index.push_back(iCol);
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      basic_index.push_back(num_col + iRow);
  }
  HighsInt num_basic_variables = basic_index.size();
  HFactor factor;
  factor.setupGeneral(&lp.a_matrix_, num_basic_variables, basic_index.data(),
                      kDefaultPivotThreshold, kDefaultPivotTolerance,
                      kHighsDebugLevelMin, &options.log_options);
  HighsInt rank_deficiency = factor.build();
  // Must not have timed out
  assert(rank_deficiency >= 0);
  // Deduce the basis from basic_index
  //
  // Set all basic variables to nonbasic
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      basis.col_status[iCol] = HighsBasisStatus::kNonbasic;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      basis.row_status[iRow] = HighsBasisStatus::kNonbasic;
  }
  // Set at most the first num_row variables in basic_index to basic
  const HighsInt use_basic_variables = std::min(num_row, num_basic_variables);
  // num_basic_variables is no longer needed, so can be used as a check
  num_basic_variables = 0;
  for (HighsInt iRow = 0; iRow < use_basic_variables; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) {
      basis.col_status[iVar] = HighsBasisStatus::kBasic;
    } else {
      basis.row_status[iVar - num_col] = HighsBasisStatus::kBasic;
    }
    num_basic_variables++;
  }
  // Complete the assignment of basic variables using the logicals of
  // non-pivotal rows
  const HighsInt num_missing = num_row - num_basic_variables;
  for (HighsInt k = 0; k < num_missing; k++) {
    HighsInt iRow = factor.row_with_no_pivot[rank_deficiency + k];
    basis.row_status[iRow] = HighsBasisStatus::kBasic;
    num_basic_variables++;
  }
  assert(num_basic_variables == num_row);
}